

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int utf8_isInvalid3(ENCODING *UNUSED_enc,char *p)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  
  bVar1 = p[2];
  if (-1 < (char)bVar1) {
    return 1;
  }
  cVar2 = *p;
  if (cVar2 == -0x11) {
    bVar3 = p[1];
    if (bVar3 != 0xbf) {
      if (0xbf < bVar1) {
        return 1;
      }
      goto LAB_004889a0;
    }
    bVar3 = 0xbf;
    if (0xbd < bVar1) {
      return 1;
    }
  }
  else {
    if (0xbf < bVar1) {
      return 1;
    }
    bVar3 = p[1];
    if (cVar2 == -0x20) {
      bVar4 = (byte)(bVar3 + 0x40) < 0xe0;
      goto LAB_004889b6;
    }
LAB_004889a0:
    bVar4 = true;
    if (-1 < (char)bVar3) goto LAB_004889b6;
  }
  bVar4 = (byte)((cVar2 != -0x13) << 5 | 0x9fU) < bVar3;
LAB_004889b6:
  return (int)bVar4;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid3(const ENCODING *UNUSED_P(enc), const char *p)
{
  return UTF8_INVALID3((const unsigned char *)p);
}